

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileHTTP::Read(FileHTTP *this,char *buffer,size_t size,size_t start)

{
  int iVar1;
  ssize_t sVar2;
  size_t __nbytes;
  ulong uVar3;
  allocator local_4f7;
  allocator local_4f6;
  allocator local_4f5;
  int local_4f4;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string local_4b0;
  string local_490;
  FileHTTP *local_470;
  char *local_468;
  size_t local_460;
  string local_458;
  char request [1024];
  
  local_468 = buffer;
  memset(request,0,0x400);
  local_460 = size;
  local_4f4 = snprintf(request,0x400,(this->request_template)._M_dataplus._M_p,
                       (this->super_Transport).m_Name._M_dataplus._M_p,
                       (this->m_hostname)._M_dataplus._M_p,start,(size - 1) + start);
  if (0x3ff < local_4f4) {
    std::__cxx11::string::string((string *)&local_4f0,"Toolkit",&local_4f5);
    std::__cxx11::string::string((string *)&local_490,"transport::file::FileHTTP",&local_4f6);
    std::__cxx11::string::string((string *)&local_4b0,"Read",&local_4f7);
    std::__cxx11::to_string(&local_458,local_4f4);
    std::operator+(&local_4d0,"request length too long:  ",&local_458);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_4f0,&local_490,&local_4b0,&local_4d0,-1)
    ;
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_4f0);
  }
  iVar1 = socket(2,1,this->m_p_proto);
  this->m_socketFileDescriptor = iVar1;
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_4f0,"Toolkit",(allocator *)&local_458);
    std::__cxx11::string::string((string *)&local_490,"transport::file::FileHTTP",&local_4f5);
    std::__cxx11::string::string((string *)&local_4b0,"Read",&local_4f6);
    std::__cxx11::string::string((string *)&local_4d0,"cannot open socket",&local_4f7);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_4f0,&local_490,&local_4b0,&local_4d0,-1)
    ;
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_4f0);
    iVar1 = this->m_socketFileDescriptor;
  }
  iVar1 = connect(iVar1,(sockaddr *)&this->sockaddr_in,0x10);
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_4f0,"Toolkit",(allocator *)&local_458);
    std::__cxx11::string::string((string *)&local_490,"transport::file::FileHTTP",&local_4f5);
    std::__cxx11::string::string((string *)&local_4b0,"Read",&local_4f6);
    std::__cxx11::string::string((string *)&local_4d0,"cannot connect",&local_4f7);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_4f0,&local_490,&local_4b0,&local_4d0,-1)
    ;
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_4f0);
  }
  local_470 = this;
  for (iVar1 = 0; local_4f4 - iVar1 != 0 && iVar1 <= local_4f4; iVar1 = iVar1 + (int)sVar2) {
    sVar2 = write(local_470->m_socketFileDescriptor,request + iVar1,(long)(local_4f4 - iVar1));
    if ((int)sVar2 == -1) {
      std::__cxx11::string::string((string *)&local_4f0,"Toolkit",(allocator *)&local_458);
      std::__cxx11::string::string((string *)&local_490,"transport::file::FileHTTP",&local_4f5);
      std::__cxx11::string::string((string *)&local_4b0,"Read",&local_4f6);
      std::__cxx11::string::string((string *)&local_4d0,"cannot send request",&local_4f7);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_4f0,&local_490,&local_4b0,&local_4d0,-1);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_4f0);
    }
  }
  for (uVar3 = 0; __nbytes = local_460 - uVar3, uVar3 <= local_460 && __nbytes != 0;
      uVar3 = uVar3 + (long)(int)sVar2) {
    if (0x1fff < __nbytes) {
      __nbytes = 0x2000;
    }
    sVar2 = read(local_470->m_socketFileDescriptor,local_468 + uVar3,__nbytes);
    if ((int)sVar2 == -1) {
      std::__cxx11::string::string((string *)&local_4f0,"Toolkit",(allocator *)&local_458);
      std::__cxx11::string::string((string *)&local_490,"transport::file::FileHTTP",&local_4f5);
      std::__cxx11::string::string((string *)&local_4b0,"Read",&local_4f6);
      std::__cxx11::string::string((string *)&local_4d0,"cannot get response",&local_4f7);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_4f0,&local_490,&local_4b0,&local_4d0,-1);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_4f0);
    }
  }
  close(local_470->m_socketFileDescriptor);
  return;
}

Assistant:

void FileHTTP::Read(char *buffer, size_t size, size_t start)
{
    /* not using BUFSIZ, the server might use another value for that */
    const size_t BUF_SIZE = 8192;
    enum CONSTEXPR
    {
        MAX_REQUEST_LEN = 1024
    };
    char request[MAX_REQUEST_LEN] = {'\0'};
    int request_len = snprintf(request, MAX_REQUEST_LEN, request_template.c_str(), m_Name.c_str(),
                               m_hostname.c_str(), start, start + size - 1);
    if (request_len >= MAX_REQUEST_LEN)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                              "request length too long:  " +
                                                  std::to_string(request_len));
    }
    m_socketFileDescriptor = socket(AF_INET, SOCK_STREAM, m_p_proto);
    if (m_socketFileDescriptor == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                              "cannot open socket");
    }
    /* Actually connect. */
    if (connect(m_socketFileDescriptor, (struct sockaddr *)&sockaddr_in, sizeof(sockaddr_in)) == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                              "cannot connect");
    }
    /* Send HTTP request. */
    int nbytes_total = 0;
    while (nbytes_total < request_len)
    {
        int nbytes_last =
            write(m_socketFileDescriptor, request + nbytes_total, request_len - nbytes_total);
        if (nbytes_last == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                                  "cannot send request");
        }
        nbytes_total += nbytes_last;
    }

    /* Read the response. */
    size_t bytes_recd = 0;
    while (bytes_recd < size)
    {
        size_t remaining = size - bytes_recd;
        int read_len = (int)(remaining < BUF_SIZE ? remaining : BUF_SIZE);
        nbytes_total = read(m_socketFileDescriptor, buffer + bytes_recd, read_len);
        if (nbytes_total == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                                  "cannot get response");
        }
        bytes_recd += nbytes_total;
    }

    close(m_socketFileDescriptor);
    return;
}